

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O2

int hasLib(char *name)

{
  char **ppcVar1;
  int iVar2;
  Library *pLVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)libCount;
  lVar4 = -1;
  pLVar3 = libraries;
  do {
    lVar4 = lVar4 + 1;
    if (lVar5 <= lVar4) {
      return 0;
    }
    ppcVar1 = &pLVar3->name;
    pLVar3 = pLVar3 + 1;
    iVar2 = strcmp(*ppcVar1,name);
  } while (iVar2 != 0);
  return 1;
}

Assistant:

static int hasLib(char *name){
    int i = 0;
    while(i < libCount){
        if(strcmp(libraries[i].name, name) == 0)
            return 1;
        i++;
    }
    return 0;
}